

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

ssize_t sendto(int __fd,void *__buf,size_t __n,int __flags,sockaddr *__addr,socklen_t __addr_len)

{
  rpchook_t *prVar1;
  bool bVar2;
  ulong uVar3;
  ssize_t sVar4;
  int *piVar5;
  ulong uVar6;
  pollfd local_40;
  sockaddr *local_38;
  
  if (g_sys_sendto_func == (sendto_pfn_t)0x0) {
    g_sys_sendto_func = (sendto_pfn_t)dlsym(0xffffffffffffffff,"sendto");
  }
  bVar2 = co_is_enable_sys_hook();
  if ((((!bVar2) || (999999 < (uint)__fd)) ||
      (prVar1 = g_rpchook_socket_fd[(uint)__fd], prVar1 == (rpchook_t *)0x0)) ||
     ((prVar1->user_flag & 0x800) != 0)) {
    sVar4 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
    return sVar4;
  }
  local_38 = __addr;
  uVar3 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)__addr,__addr_len);
  uVar6 = uVar3;
  if ((long)uVar3 < 0) {
    piVar5 = __errno_location();
    if (*piVar5 != 0xb) {
      return uVar3;
    }
    uVar3 = 0;
    uVar6 = uVar3;
  }
  do {
    if (__n <= uVar6) {
LAB_00105258:
      if (0 < (long)uVar3) {
        uVar3 = uVar6;
      }
      if (uVar6 != 0) {
        uVar3 = uVar6;
      }
      return uVar3;
    }
    local_40.events = 0x1c;
    local_40.revents = 0;
    local_40.fd = __fd;
    poll(&local_40,1,
         (int)(prVar1->write_timeout).tv_sec * 1000 + (int)((prVar1->write_timeout).tv_usec / 1000))
    ;
    uVar3 = (*g_sys_sendto_func)(__fd,__buf,__n,__flags,(sockaddr *)local_38,__addr_len);
    if ((long)uVar3 < 0) {
      piVar5 = __errno_location();
      if (*piVar5 == 0xb) {
        *piVar5 = 0x7c5;
      }
      goto LAB_00105258;
    }
    uVar6 = uVar6 + uVar3;
  } while( true );
}

Assistant:

ssize_t sendto(int socket, const void *message, size_t length,
	                 int flags, const struct sockaddr *dest_addr,
					               socklen_t dest_len)
{
	/*
		1.no enable sys call ? sys
		2.( !lp || lp is non block ) ? sys
		3.try
		4.wait
		5.try
	*/
	HOOK_SYS_FUNC( sendto );
	if( !co_is_enable_sys_hook() )
	{
		return g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
	}

	rpchook_t *lp = get_by_fd( socket );
	if( !lp || ( O_NONBLOCK & lp->user_flag ) )
	{
		return g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
	}

	ssize_t ret = g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );

	if( ret < 0 && (EAGAIN == errno || EWOULDBLOCK == errno)){
		ret = 0;
	}

	if(ret<0) return ret;

	size_t bytes_written = ret;
	while(bytes_written < length){
		int timeout = ( lp->write_timeout.tv_sec * 1000 ) 
					+ ( lp->write_timeout.tv_usec / 1000 );


		struct pollfd pf = { 0 };
		pf.fd = socket;
		pf.events = ( POLLOUT | POLLERR | POLLHUP );
		poll( &pf,1,timeout );

		ret = g_sys_sendto_func( socket,message,length,flags,dest_addr,dest_len );
		if(ret <0 ){
			//timeout from co_routine_poll, errno set to indicate special value
			if( errno == EAGAIN  || errno == EWOULDBLOCK ){
				//poll timed out , the socket is still unwritable
				errno = LIBCO_POLL_TIMEOUT;
			}
			break;
		}
		bytes_written += ret ;
	}
	if (ret <= 0 && bytes_written == 0){
		return ret;
	}
	return bytes_written;
}